

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprModule * Analyze(ExpressionContext *ctx,SynModule *syntax,char *code,char *moduleRoot)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TypeStruct *pTVar7;
  MemberHandle *pMVar8;
  VariableData *pVVar9;
  undefined4 extraout_var_14;
  TypeRef *pTVar10;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  ExprModule *pEVar11;
  InplaceStr name;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  TraceScope traceScope;
  uint in_stack_ffffffffffffffc0;
  TypeBase *pTVar6;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  
  if ((Analyze(ExpressionContext&,SynModule*,char_const*,char_const*)::token == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Analyze(ExpressionContext&,SynModule*,char_const*,char_const*)::
                                   token), iVar3 != 0)) {
    Analyze::token = NULLC::TraceGetToken("analyze","Analyze");
    __cxa_guard_release(&Analyze(ExpressionContext&,SynModule*,char_const*,char_const*)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&stack0xffffffffffffffc0,Analyze::token);
  if (ctx->globalScope != (ScopeData *)0x0) {
    __assert_fail("!ctx.globalScope",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x3552,
                  "ExprModule *Analyze(ExpressionContext &, SynModule *, const char *, const char *)"
                 );
  }
  ctx->code = code;
  sVar5 = strlen(code);
  ctx->codeEnd = code + sVar5;
  ctx->moduleRoot = moduleRoot;
  ExpressionContext::PushScope(ctx,SCOPE_EXPLICIT);
  ctx->globalScope = ctx->scope;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 1;
  (pTVar6->name).begin = "void";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("void","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->alignment = 0;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  pTVar6->padding = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_002244a0;
  pTVar6->size = 0;
  ctx->typeVoid = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var_00,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 2;
  (pTVar6->name).begin = "bool";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("bool","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  *(undefined8 *)&pTVar6->alignment = 0;
  *(undefined8 *)((long)&pTVar6->size + 4) = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_002244d8;
  pTVar6->size = 1;
  ctx->typeBool = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var_01,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 3;
  (pTVar6->name).begin = "char";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("char","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  *(undefined8 *)&pTVar6->alignment = 0;
  *(undefined8 *)((long)&pTVar6->size + 4) = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00224510;
  pTVar6->size = 1;
  ctx->typeChar = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var_02,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 4;
  (pTVar6->name).begin = "short";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("short","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->alignment = 2;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  pTVar6->padding = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00224548;
  pTVar6->size = 2;
  ctx->typeShort = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var_03,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 5;
  (pTVar6->name).begin = "int";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("int","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->alignment = 4;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  pTVar6->padding = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00224580;
  pTVar6->size = 4;
  ctx->typeInt = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var_04,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 6;
  (pTVar6->name).begin = "long";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("long","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->alignment = 8;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  pTVar6->padding = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_002245b8;
  pTVar6->size = 8;
  ctx->typeLong = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var_05,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 7;
  (pTVar6->name).begin = "float";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("float","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->alignment = 4;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  pTVar6->padding = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_002245f0;
  pTVar6->size = 4;
  ctx->typeFloat = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var_06,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 8;
  (pTVar6->name).begin = "double";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("double","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->alignment = 8;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  pTVar6->padding = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00224628;
  pTVar6->size = 8;
  ctx->typeDouble = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var_07,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 9;
  (pTVar6->name).begin = "typeid";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("typeid","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->alignment = 4;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  pTVar6->padding = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00224660;
  pTVar6->size = 4;
  ctx->typeTypeID = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var_08,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 10;
  (pTVar6->name).begin = "__function";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("__function","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->alignment = 4;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  pTVar6->padding = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00224698;
  pTVar6->size = 4;
  ctx->typeFunctionID = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var_09,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 0xb;
  (pTVar6->name).begin = "__nullptr";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("__nullptr","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->alignment = 4;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  pTVar6->padding = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_002246d0;
  pTVar6->size = 8;
  ctx->typeNullPtr = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var_10,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 0xc;
  (pTVar6->name).begin = "generic";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("generic","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  *(undefined8 *)&pTVar6->alignment = 0;
  *(undefined8 *)((long)&pTVar6->size + 4) = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00224708;
  pTVar6->isGeneric = true;
  ctx->typeGeneric = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pTVar6 = (TypeBase *)CONCAT44(extraout_var_11,iVar3);
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  pTVar6->typeID = 0xe;
  (pTVar6->name).begin = "auto";
  (pTVar6->name).end = "";
  (pTVar6->arrayTypes).head = (TypeHandle *)0x0;
  (pTVar6->arrayTypes).tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("auto","");
  pTVar6->nameHash = uVar4;
  pTVar6->importModule = (ModuleData *)0x0;
  pTVar6->typeIndex = 0xffffffff;
  pTVar6->refType = (TypeRef *)0x0;
  pTVar6->unsizedArrayType = (TypeUnsizedArray *)0x0;
  *(undefined8 *)&pTVar6->alignment = 0;
  *(undefined8 *)((long)&pTVar6->size + 4) = 0;
  *(undefined4 *)((long)&pTVar6->padding + 3) = 0;
  pTVar6->_vptr_TypeBase = (_func_int **)&PTR__TypeBase_00224740;
  ctx->typeAuto = pTVar6;
  ExpressionContext::AddType(ctx,pTVar6);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x88);
  pTVar7 = (TypeStruct *)CONCAT44(extraout_var_12,iVar3);
  (pTVar7->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  (pTVar7->super_TypeBase).typeID = 0x10;
  (pTVar7->super_TypeBase).name.begin = "auto ref";
  (pTVar7->super_TypeBase).name.end = "";
  (pTVar7->super_TypeBase).arrayTypes.head = (TypeHandle *)0x0;
  (pTVar7->super_TypeBase).arrayTypes.tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("auto ref","");
  (pTVar7->super_TypeBase).nameHash = uVar4;
  (pTVar7->super_TypeBase).importModule = (ModuleData *)0x0;
  (pTVar7->super_TypeBase).typeIndex = 0xffffffff;
  (pTVar7->super_TypeBase).refType = (TypeRef *)0x0;
  *(undefined8 *)&(pTVar7->super_TypeBase).alignment = 0;
  *(undefined8 *)((long)&(pTVar7->super_TypeBase).size + 4) = 0;
  *(undefined4 *)((long)&(pTVar7->super_TypeBase).padding + 3) = 0;
  (pTVar7->super_TypeBase).unsizedArrayType = (TypeUnsizedArray *)0x0;
  pTVar7->typeScope = (ScopeData *)0x0;
  (pTVar7->members).head = (MemberHandle *)0x0;
  (pTVar7->members).tail = (MemberHandle *)0x0;
  (pTVar7->constants).head = (ConstantData *)0x0;
  (pTVar7->constants).tail = (ConstantData *)0x0;
  (pTVar7->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00224778;
  (pTVar7->super_TypeBase).hasPointers = true;
  ctx->typeAutoRef = pTVar7;
  ExpressionContext::AddType(ctx,(TypeBase *)pTVar7);
  ExpressionContext::PushScope(ctx,&ctx->typeAutoRef->super_TypeBase);
  pTVar7 = ctx->typeAutoRef;
  pTVar7->typeScope = ctx->scope;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
  pMVar8 = (MemberHandle *)CONCAT44(extraout_var_13,iVar3);
  uVar4 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar4 + 1;
  name.end = "";
  name.begin = "type";
  pVVar9 = anon_unknown.dwarf_9c70f::AllocateClassMember
                     (ctx,&syntax->super_SynBase,0,ctx->typeTypeID,name,SUB41(uVar4,0),
                      in_stack_ffffffffffffffc0);
  pMVar8->source = &syntax->super_SynBase;
  pMVar8->variable = pVVar9;
  pMVar8->initializer = (SynBase *)0x0;
  pMVar8->next = (MemberHandle *)0x0;
  pMVar8->listed = false;
  IntrusiveList<MemberHandle>::push_back(&pTVar7->members,pMVar8);
  pTVar7 = ctx->typeAutoRef;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
  pMVar8 = (MemberHandle *)CONCAT44(extraout_var_14,iVar3);
  pTVar10 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
  uVar4 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar4 + 1;
  name_00.end = "";
  name_00.begin = "ptr";
  pVVar9 = anon_unknown.dwarf_9c70f::AllocateClassMember
                     (ctx,&syntax->super_SynBase,0,&pTVar10->super_TypeBase,name_00,SUB41(uVar4,0),
                      in_stack_ffffffffffffffc0);
  pMVar8->source = &syntax->super_SynBase;
  pMVar8->variable = pVVar9;
  pMVar8->initializer = (SynBase *)0x0;
  pMVar8->next = (MemberHandle *)0x0;
  pMVar8->listed = false;
  IntrusiveList<MemberHandle>::push_back(&pTVar7->members,pMVar8);
  anon_unknown.dwarf_9c70f::FinalizeAlignment(ctx->typeAutoRef);
  ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x88);
  pTVar7 = (TypeStruct *)CONCAT44(extraout_var_15,iVar3);
  (pTVar7->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  (pTVar7->super_TypeBase).typeID = 0x11;
  (pTVar7->super_TypeBase).name.begin = "auto[]";
  (pTVar7->super_TypeBase).name.end = "";
  (pTVar7->super_TypeBase).arrayTypes.head = (TypeHandle *)0x0;
  (pTVar7->super_TypeBase).arrayTypes.tail = (TypeHandle *)0x0;
  uVar4 = NULLC::GetStringHash("auto[]","");
  (pTVar7->super_TypeBase).nameHash = uVar4;
  (pTVar7->super_TypeBase).importModule = (ModuleData *)0x0;
  (pTVar7->super_TypeBase).typeIndex = 0xffffffff;
  (pTVar7->super_TypeBase).refType = (TypeRef *)0x0;
  *(undefined8 *)&(pTVar7->super_TypeBase).alignment = 0;
  *(undefined8 *)((long)&(pTVar7->super_TypeBase).size + 4) = 0;
  *(undefined4 *)((long)&(pTVar7->super_TypeBase).padding + 3) = 0;
  (pTVar7->super_TypeBase).unsizedArrayType = (TypeUnsizedArray *)0x0;
  pTVar7->typeScope = (ScopeData *)0x0;
  (pTVar7->members).head = (MemberHandle *)0x0;
  (pTVar7->members).tail = (MemberHandle *)0x0;
  (pTVar7->constants).head = (ConstantData *)0x0;
  (pTVar7->constants).tail = (ConstantData *)0x0;
  (pTVar7->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_002247b0;
  (pTVar7->super_TypeBase).hasPointers = true;
  ctx->typeAutoArray = pTVar7;
  ExpressionContext::AddType(ctx,(TypeBase *)pTVar7);
  ExpressionContext::PushScope(ctx,&ctx->typeAutoArray->super_TypeBase);
  pTVar7 = ctx->typeAutoArray;
  pTVar7->typeScope = ctx->scope;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
  pMVar8 = (MemberHandle *)CONCAT44(extraout_var_16,iVar3);
  uVar4 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar4 + 1;
  name_01.end = "";
  name_01.begin = "type";
  pVVar9 = anon_unknown.dwarf_9c70f::AllocateClassMember
                     (ctx,&syntax->super_SynBase,0,ctx->typeTypeID,name_01,SUB41(uVar4,0),
                      in_stack_ffffffffffffffc0);
  pMVar8->source = &syntax->super_SynBase;
  pMVar8->variable = pVVar9;
  pMVar8->initializer = (SynBase *)0x0;
  pMVar8->next = (MemberHandle *)0x0;
  pMVar8->listed = false;
  IntrusiveList<MemberHandle>::push_back(&pTVar7->members,pMVar8);
  pTVar7 = ctx->typeAutoArray;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
  pMVar8 = (MemberHandle *)CONCAT44(extraout_var_17,iVar3);
  pTVar10 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
  uVar4 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar4 + 1;
  name_02.end = "";
  name_02.begin = "ptr";
  pVVar9 = anon_unknown.dwarf_9c70f::AllocateClassMember
                     (ctx,&syntax->super_SynBase,0,&pTVar10->super_TypeBase,name_02,SUB41(uVar4,0),
                      in_stack_ffffffffffffffc0);
  pMVar8->source = &syntax->super_SynBase;
  pMVar8->variable = pVVar9;
  pMVar8->initializer = (SynBase *)0x0;
  pMVar8->next = (MemberHandle *)0x0;
  pMVar8->listed = false;
  IntrusiveList<MemberHandle>::push_back(&pTVar7->members,pMVar8);
  pTVar7 = ctx->typeAutoArray;
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
  pMVar8 = (MemberHandle *)CONCAT44(extraout_var_18,iVar3);
  uVar4 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar4 + 1;
  name_03.end = "";
  name_03.begin = "size";
  pVVar9 = anon_unknown.dwarf_9c70f::AllocateClassMember
                     (ctx,&syntax->super_SynBase,0,ctx->typeInt,name_03,SUB41(uVar4,0),
                      in_stack_ffffffffffffffc0);
  pMVar8->source = &syntax->super_SynBase;
  pMVar8->variable = pVVar9;
  pMVar8->initializer = (SynBase *)0x0;
  pMVar8->next = (MemberHandle *)0x0;
  pMVar8->listed = false;
  IntrusiveList<MemberHandle>::push_back(&pTVar7->members,pMVar8);
  anon_unknown.dwarf_9c70f::FinalizeAlignment(ctx->typeAutoArray);
  ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
  uVar4 = *(uint *)(NULLC::traceContext + 0x244);
  iVar3 = _setjmp((__jmp_buf_tag *)ctx->errorHandler);
  lVar2 = NULLC::traceContext;
  if (iVar3 == 0) {
    ctx->errorHandlerActive = true;
    if (ctx->memoryLimit != 0) {
      iVar3 = (*ctx->allocator->_vptr_Allocator[4])();
      (*ctx->allocator->_vptr_Allocator[6])
                (ctx->allocator,(ulong)(iVar3 + ctx->memoryLimit),ctx,
                 anon_unknown.dwarf_9c70f::OnMemoryLimitHit);
    }
    pEVar11 = AnalyzeModule(ctx,syntax);
    ctx->errorHandlerActive = false;
    if (ctx->memoryLimit != 0) {
      (*ctx->allocator->_vptr_Allocator[5])();
    }
    uVar4 = NULLCTime::clockMicro();
    (ctx->statistics).startTime = uVar4;
    (ctx->statistics).finishTime = 0;
    if (ctx->scope->type != SCOPE_EXPLICIT) {
      __assert_fail("ctx.scope->type == SCOPE_EXPLICIT",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x3598,
                    "ExprModule *Analyze(ExpressionContext &, SynModule *, const char *, const char *)"
                   );
    }
    ctx->scope = ctx->scope->scope;
    uVar4 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(&ctx->statistics,"Cleanup",uVar4);
    if (ctx->scope != (ScopeData *)0x0) {
      __assert_fail("ctx.scope == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x359d,
                    "ExprModule *Analyze(ExpressionContext &, SynModule *, const char *, const char *)"
                   );
    }
  }
  else {
    uVar1 = *(uint *)(NULLC::traceContext + 0x244);
    while (uVar4 < uVar1) {
      NULLC::TraceLeave(0.0,0,0);
      uVar1 = *(uint *)(lVar2 + 0x244);
    }
    if (ctx->memoryLimit != 0) {
      (*ctx->allocator->_vptr_Allocator[5])();
    }
    if (ctx->errorPos == (char *)0x0) {
      __assert_fail("ctx.errorPos != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x35a9,
                    "ExprModule *Analyze(ExpressionContext &, SynModule *, const char *, const char *)"
                   );
    }
    pEVar11 = (ExprModule *)0x0;
  }
  ctx->moduleRoot = (char *)0x0;
  NULLC::TraceScope::~TraceScope((TraceScope *)&stack0xffffffffffffffc0);
  return pEVar11;
}

Assistant:

ExprModule* Analyze(ExpressionContext &ctx, SynModule *syntax, const char *code, const char *moduleRoot)
{
	TRACE_SCOPE("analyze", "Analyze");

	assert(!ctx.globalScope);

	ctx.code = code;
	ctx.codeEnd = code + strlen(code);

	ctx.moduleRoot = moduleRoot;

	ctx.PushScope(SCOPE_EXPLICIT);
	ctx.globalScope = ctx.scope;

	ctx.AddType(ctx.typeVoid = new (ctx.get<TypeVoid>()) TypeVoid(InplaceStr("void")));

	ctx.AddType(ctx.typeBool = new (ctx.get<TypeBool>()) TypeBool(InplaceStr("bool")));

	ctx.AddType(ctx.typeChar = new (ctx.get<TypeChar>()) TypeChar(InplaceStr("char")));
	ctx.AddType(ctx.typeShort = new (ctx.get<TypeShort>()) TypeShort(InplaceStr("short")));
	ctx.AddType(ctx.typeInt = new (ctx.get<TypeInt>()) TypeInt(InplaceStr("int")));
	ctx.AddType(ctx.typeLong = new (ctx.get<TypeLong>()) TypeLong(InplaceStr("long")));

	ctx.AddType(ctx.typeFloat = new (ctx.get<TypeFloat>()) TypeFloat(InplaceStr("float")));
	ctx.AddType(ctx.typeDouble = new (ctx.get<TypeDouble>()) TypeDouble(InplaceStr("double")));

	ctx.AddType(ctx.typeTypeID = new (ctx.get<TypeTypeID>()) TypeTypeID(InplaceStr("typeid")));
	ctx.AddType(ctx.typeFunctionID = new (ctx.get<TypeFunctionID>()) TypeFunctionID(InplaceStr("__function")));
	ctx.AddType(ctx.typeNullPtr = new (ctx.get<TypeNullptr>()) TypeNullptr(InplaceStr("__nullptr")));

	ctx.AddType(ctx.typeGeneric = new (ctx.get<TypeGeneric>()) TypeGeneric(InplaceStr("generic")));

	ctx.AddType(ctx.typeAuto = new (ctx.get<TypeAuto>()) TypeAuto(InplaceStr("auto")));

	ctx.AddType(ctx.typeAutoRef = new (ctx.get<TypeAutoRef>()) TypeAutoRef(InplaceStr("auto ref")));
	ctx.PushScope(ctx.typeAutoRef);
	ctx.typeAutoRef->typeScope = ctx.scope;
	ctx.typeAutoRef->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.typeTypeID, InplaceStr("type"), true, ctx.uniqueVariableId++), NULL));
	ctx.typeAutoRef->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.GetReferenceType(ctx.typeVoid), InplaceStr("ptr"), true, ctx.uniqueVariableId++), NULL));
	FinalizeAlignment(ctx.typeAutoRef);
	ctx.PopScope(SCOPE_TYPE);

	ctx.AddType(ctx.typeAutoArray = new (ctx.get<TypeAutoArray>()) TypeAutoArray(InplaceStr("auto[]")));
	ctx.PushScope(ctx.typeAutoArray);
	ctx.typeAutoArray->typeScope = ctx.scope;
	ctx.typeAutoArray->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.typeTypeID, InplaceStr("type"), true, ctx.uniqueVariableId++), NULL));
	ctx.typeAutoArray->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.GetReferenceType(ctx.typeVoid), InplaceStr("ptr"), true, ctx.uniqueVariableId++), NULL));
	ctx.typeAutoArray->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(syntax, AllocateClassMember(ctx, syntax, 0, ctx.typeInt, InplaceStr("size"), true, ctx.uniqueVariableId++), NULL));
	FinalizeAlignment(ctx.typeAutoArray);
	ctx.PopScope(SCOPE_TYPE);

	unsigned traceDepth = NULLC::TraceGetDepth();

	// Analyze module
	if(!setjmp(ctx.errorHandler))
	{
		ctx.errorHandlerActive = true;

		if(ctx.memoryLimit != 0)
		{
			unsigned totalLimit = ctx.allocator->requested() + ctx.memoryLimit;

			ctx.allocator->set_limit(totalLimit, &ctx, OnMemoryLimitHit);
		}

		ExprModule *module = AnalyzeModule(ctx, syntax);

		ctx.errorHandlerActive = false;

		if(ctx.memoryLimit != 0)
			ctx.allocator->clear_limit();

		ctx.statistics.Start(NULLCTime::clockMicro());

		assert(ctx.scope->type == SCOPE_EXPLICIT);
		ctx.scope = ctx.scope->scope;

		ctx.statistics.Finish("Cleanup", NULLCTime::clockMicro());

		assert(ctx.scope == NULL);

		ctx.moduleRoot = NULL;

		return module;
	}

	NULLC::TraceLeaveTo(traceDepth);

	if(ctx.memoryLimit != 0)
		ctx.allocator->clear_limit();

	assert(ctx.errorPos != NULL);

	ctx.moduleRoot = NULL;

	return NULL;
}